

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O3

UDataMemory *
doLoadFromCommonData
          (UBool isICUData,char *param_2,char *param_3,char *param_4,char *tocEntryName,char *path,
          char *type,char *name,UDataMemoryIsAcceptable *isAcceptable,void *context,
          UErrorCode *subErrorCode,UErrorCode *pErrorCode)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  UDataMemory *pUVar4;
  DataHeader *pHeader;
  UDataMemory *pUVar5;
  long lVar6;
  int commonDataIndex;
  UDataMemory local_68;
  
  commonDataIndex = -(uint)(isICUData == '\0');
  bVar1 = false;
  do {
    while( true ) {
      pUVar4 = openCommonData(param_3,commonDataIndex,(UErrorCode *)name);
      iVar3 = *(int *)name;
      if (pUVar4 != (UDataMemory *)0x0 && iVar3 < 1) {
        pHeader = (*pUVar4->vFuncs->Lookup)(pUVar4,param_2,(int32_t *)&local_68,(UErrorCode *)name);
        if (pHeader != (DataHeader *)0x0) {
          pUVar5 = checkDataItem(pHeader,(UDataMemoryIsAcceptable *)path,type,param_4,tocEntryName,
                                 (UErrorCode *)name,(UErrorCode *)isAcceptable);
          if (0 < *(int *)isAcceptable) {
            return (UDataMemory *)0x0;
          }
          if (pUVar5 != (UDataMemory *)0x0) {
            pUVar5->length = (int32_t)local_68.vFuncs;
            return pUVar5;
          }
        }
        iVar3 = *(int *)name;
      }
      if (iVar3 == 7) {
        *(undefined4 *)isAcceptable = 7;
        return (UDataMemory *)0x0;
      }
      if (isICUData == '\0') {
        return (UDataMemory *)0x0;
      }
      if (pUVar4 == (UDataMemory *)0x0) break;
      commonDataIndex = commonDataIndex + 1;
    }
    if (bVar1) {
      return (UDataMemory *)0x0;
    }
    if (gHaveTriedToLoadCommonData.super___atomic_base<int>._M_i == 0) {
      pUVar4 = openCommonData("icudt63l",-1,(UErrorCode *)name);
      UDataMemory_init_63(&local_68);
      if (pUVar4 != (UDataMemory *)0x0) {
        UDatamemory_assign_63(&local_68,pUVar4);
        local_68.mapAddr = (void *)0x0;
        local_68.map = (void *)0x0;
        setCommonICUData(&local_68,'\0',(UErrorCode *)name);
      }
      gHaveTriedToLoadCommonData.super___atomic_base<int>._M_i = (__atomic_base<int>)1;
    }
    pUVar4 = udata_findCachedData("icudt63l",(UErrorCode *)name);
    if (pUVar4 == (UDataMemory *)0x0) {
      return (UDataMemory *)0x0;
    }
    if (0 < *(int *)name) {
      return (UDataMemory *)0x0;
    }
    umtx_lock_63((UMutex *)0x0);
    lVar6 = 0;
    do {
      if ((*(long *)((long)gCommonICUDataArray + lVar6) != 0) &&
         (*(DataHeader **)(*(long *)((long)gCommonICUDataArray + lVar6) + 8) == pUVar4->pHeader)) {
        bVar2 = false;
        goto LAB_002db154;
      }
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x50);
    bVar2 = true;
LAB_002db154:
    umtx_unlock_63((UMutex *)0x0);
    bVar1 = true;
    if (bVar2) {
      return (UDataMemory *)0x0;
    }
  } while( true );
}

Assistant:

static UDataMemory *doLoadFromCommonData(UBool isICUData, const char * /*pkgName*/, 
        const char * /*dataPath*/, const char * /*tocEntryPathSuffix*/, const char *tocEntryName,
            /* following arguments are the same as doOpenChoice itself */
            const char *path, const char *type, const char *name,
             UDataMemoryIsAcceptable *isAcceptable, void *context,
             UErrorCode *subErrorCode,
             UErrorCode *pErrorCode)
{
    UDataMemory        *pEntryData;
    const DataHeader   *pHeader;
    UDataMemory        *pCommonData;
    int32_t            commonDataIndex;
    UBool              checkedExtendedICUData = FALSE;
    /* try to get common data.  The loop is for platforms such as the 390 that do
     *  not initially load the full set of ICU data.  If the lookup of an ICU data item
     *  fails, the full (but slower to load) set is loaded, the and the loop repeats,
     *  trying the lookup again.  Once the full set of ICU data is loaded, the loop wont
     *  repeat because the full set will be checked the first time through.
     *
     *  The loop also handles the fallback to a .dat file if the application linked
     *   to the stub data library rather than a real library.
     */
    for (commonDataIndex = isICUData ? 0 : -1;;) {
        pCommonData=openCommonData(path, commonDataIndex, subErrorCode); /** search for pkg **/

        if(U_SUCCESS(*subErrorCode) && pCommonData!=NULL) {
            int32_t length;

            /* look up the data piece in the common data */
            pHeader=pCommonData->vFuncs->Lookup(pCommonData, tocEntryName, &length, subErrorCode);
#ifdef UDATA_DEBUG
            fprintf(stderr, "%s: pHeader=%p - %s\n", tocEntryName, pHeader, u_errorName(*subErrorCode));
#endif

            if(pHeader!=NULL) {
                pEntryData = checkDataItem(pHeader, isAcceptable, context, type, name, subErrorCode, pErrorCode);
#ifdef UDATA_DEBUG
                fprintf(stderr, "pEntryData=%p\n", pEntryData);
#endif
                if (U_FAILURE(*pErrorCode)) {
                    return NULL;
                }
                if (pEntryData != NULL) {
                    pEntryData->length = length;
                    return pEntryData;
                }
            }
        }
        // If we failed due to being out-of-memory, then stop early and report the error.
        if (*subErrorCode == U_MEMORY_ALLOCATION_ERROR) {
            *pErrorCode = *subErrorCode;
            return NULL;
        }
        /* Data wasn't found.  If we were looking for an ICUData item and there is
         * more data available, load it and try again,
         * otherwise break out of this loop. */
        if (!isICUData) {
            return NULL;
        } else if (pCommonData != NULL) {
            ++commonDataIndex;  /* try the next data package */
        } else if ((!checkedExtendedICUData) && extendICUData(subErrorCode)) {
            checkedExtendedICUData = TRUE;
            /* try this data package slot again: it changed from NULL to non-NULL */
        } else {
            return NULL;
        }
    }
}